

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

MPP_RET mpi_enc_test_cmd_show_opt(MpiEncTestArgs *cmd)

{
  MpiEncTestArgs *cmd_local;
  
  _mpp_log_l(4,"mpi_enc_utils","cmd parse result:\n",0);
  _mpp_log_l(4,"mpi_enc_utils","input  file name: %s\n",0,cmd->file_input);
  _mpp_log_l(4,"mpi_enc_utils","output file name: %s\n",0,cmd->file_output);
  _mpp_log_l(4,"mpi_enc_utils","width      : %d\n",0,cmd->width);
  _mpp_log_l(4,"mpi_enc_utils","height     : %d\n",0,cmd->height);
  _mpp_log_l(4,"mpi_enc_utils","format     : %d\n",0,cmd->format);
  _mpp_log_l(4,"mpi_enc_utils","type       : %d\n",0,cmd->type);
  if (cmd->file_slt != (char *)0x0) {
    _mpp_log_l(4,"mpi_enc_utils","verify     : %s\n",0,cmd->file_slt);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpi_enc_test_cmd_show_opt(MpiEncTestArgs* cmd)
{
    mpp_log("cmd parse result:\n");
    mpp_log("input  file name: %s\n", cmd->file_input);
    mpp_log("output file name: %s\n", cmd->file_output);
    mpp_log("width      : %d\n", cmd->width);
    mpp_log("height     : %d\n", cmd->height);
    mpp_log("format     : %d\n", cmd->format);
    mpp_log("type       : %d\n", cmd->type);
    if (cmd->file_slt)
        mpp_log("verify     : %s\n", cmd->file_slt);

    return MPP_OK;
}